

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ORForest.cpp
# Opt level: O3

void __thiscall
RandomForest::ORForest<float>::GetRankedGiniImportance
          (ORForest<float> *this,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_featureIndexList,
          shared_ptr<std::vector<double,_std::allocator<double>_>_> *o_giniImportanceList)

{
  double dVar1;
  int iVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> *this_00;
  element_type *peVar4;
  pointer psVar5;
  element_type *peVar6;
  pointer piVar7;
  pointer pdVar8;
  __shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  vector<double,_std::allocator<double>_> *pvVar10;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> *psVar11;
  pointer piVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ODTree<float> *this_01;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> featureIndexList;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> giniImportanceList;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  vector<double,_std::allocator<double>_> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> *local_58;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> *local_50;
  double local_48;
  long *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this_00 = (o_featureIndexList->
            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  local_70._M_pi =
       (o_featureIndexList->
       super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
    }
  }
  local_68 = (o_giniImportanceList->
             super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  local_60._M_pi =
       (o_giniImportanceList->
       super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>)
       ._M_refcount._M_pi;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
  }
  peVar4 = (this->trainData).
           super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  psVar5 = (peVar4->
           super__Vector_base<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = o_featureIndexList;
  local_50 = o_giniImportanceList;
  if ((peVar4->
      super__Vector_base<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    peVar6 = (psVar5->
             super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    std::vector<int,_std::allocator<int>_>::resize
              (this_00,((long)*(pointer *)
                               ((long)&(peVar6->super__Vector_base<float,_std::allocator<float>_>).
                                       _M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(peVar6->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data >> 2) - 1);
    pvVar10 = local_68;
    peVar4 = (this->trainData).
             super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    psVar5 = (peVar4->
             super__Vector_base<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((peVar4->
        super__Vector_base<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != psVar5) {
      peVar6 = (psVar5->
               super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      std::vector<double,_std::allocator<double>_>::resize
                (local_68,((long)*(pointer *)
                                  ((long)&(peVar6->super__Vector_base<float,_std::allocator<float>_>
                                          )._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&(peVar6->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data >> 2) - 1);
      piVar12 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar13 = (long)piVar7 - (long)piVar12 >> 2;
      if (piVar7 != piVar12) {
        pdVar8 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = (long)(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
        lVar16 = 0;
        do {
          piVar12[lVar16] = (int)lVar16;
          if (lVar14 == lVar16) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       lVar14);
          }
          pdVar8[lVar16] = 0.0;
          lVar16 = lVar16 + 1;
        } while (uVar13 + (uVar13 == 0) != lVar16);
      }
      this_01 = (this->trees).
                super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (this_01 !=
          (this->trees).
          super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          ODTree<float>::UpdateGiniImportance(this_01);
          if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish !=
              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            uVar13 = 0;
            do {
              pdVar8 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <=
                  uVar13) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar13);
              }
              local_48 = pdVar8[uVar13];
              ODTree<float>::GetGiniImportance(this_01);
              if (((ulong)(local_40[1] - *local_40 >> 3) <= uVar13) ||
                 (pdVar8 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start,
                 (ulong)((long)(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <=
                 uVar13)) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar13);
              }
              pdVar8[uVar13] = local_48 + *(double *)(*local_40 + uVar13 * 8);
              if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < (ulong)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)
                                            ._M_impl.super__Vector_impl_data._M_start >> 2));
          }
          this_01 = this_01 + 1;
        } while (this_01 !=
                 (this->trees).
                 super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        piVar12 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar12 >> 2;
      }
      psVar11 = local_50;
      if (uVar13 != 1) {
        uVar17 = 1;
        uVar18 = 0;
        do {
          uVar19 = uVar18 + 1;
          if (uVar19 < uVar13) {
            pdVar8 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar15 = (long)(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
            uVar20 = uVar17;
            if (uVar15 <= uVar18) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            do {
              if (uVar15 <= uVar20) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar15);
              }
              dVar1 = pdVar8[uVar18];
              if (dVar1 < pdVar8[uVar20]) {
                iVar2 = piVar12[uVar18];
                iVar3 = piVar12[uVar20];
                pdVar8[uVar18] = pdVar8[uVar20];
                pdVar8[uVar20] = dVar1;
                piVar12[uVar18] = iVar3;
                piVar12[uVar20] = iVar2;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < uVar13);
          }
          uVar17 = uVar17 + 1;
          uVar18 = uVar19;
        } while (uVar19 != uVar13 - 1);
      }
      p_Var9 = &local_50->
                super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
      ;
      (local_58->
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(local_58->
                  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_70);
      (psVar11->
      super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = pvVar10;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&p_Var9->_M_refcount,&local_60);
      if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
      }
      if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
      }
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

void RandomForest::ORForest<T>::GetRankedGiniImportance( std::shared_ptr<std::vector<int> > * o_featureIndexList,  std::shared_ptr<std::vector<double> > * o_giniImportanceList)
{
    std::shared_ptr<std::vector<int> > featureIndexList=* o_featureIndexList;
    std::shared_ptr<std::vector<double> > giniImportanceList=* o_giniImportanceList;
    featureIndexList->resize(trainData->at(0)->size()-1);
    giniImportanceList->resize(trainData->at(0)->size()-1);
    for(int i=0;i<featureIndexList->size();i++)
    {
        featureIndexList->at(i)=i;
        giniImportanceList->at(i)=0.0;
    }
    for (TreeListIterator tree_iter = trees.begin(); tree_iter != trees.end(); tree_iter++)
    {
        tree_iter->UpdateGiniImportance();
        for(int j=0;j<featureIndexList->size();j++)
        {
            giniImportanceList->at(j) = giniImportanceList->at(j) + tree_iter->GetGiniImportance()->at(j);
        }
    }
    
    // sorting
    for(int i=0;i<featureIndexList->size()-1;i++)
    {
        for(int j=i+1;j<featureIndexList->size();j++)
        {
            double leftValue=giniImportanceList->at(i);
            double rightValue=giniImportanceList->at(j);
            if(leftValue<rightValue)
            {
                int leftIndex=featureIndexList->at(i);
                int rightIndex=featureIndexList->at(j);
                giniImportanceList->at(i)=rightValue;
                giniImportanceList->at(j)=leftValue;
                featureIndexList->at(i)=rightIndex;
                featureIndexList->at(j)=leftIndex;
            }
        }
    }
    
    *o_featureIndexList=featureIndexList;
    *o_giniImportanceList=giniImportanceList;
}